

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::reduceu
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  uint16_t uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  void *local_68;
  
  switch(dt) {
  case dt_uint8:
    iVar5 = uw * nchan;
    pvVar2 = (void *)((long)(vw * sstride) + (long)src);
    lVar4 = (long)nchan;
    lVar3 = lVar4 + (long)src;
    for (; src != pvVar2; src = (void *)((long)iVar5 + (long)src + (long)(sstride - iVar5))) {
      pvVar6 = src;
      lVar10 = lVar3;
      while (pvVar6 != (void *)((long)iVar5 + (long)src)) {
        for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
          *(char *)((long)dst + lVar8) =
               (char)((uint)*(byte *)(lVar10 + lVar8) + (uint)*(byte *)((long)pvVar6 + lVar8) >> 1);
        }
        dst = (void *)((long)dst + lVar8);
        lVar10 = lVar10 + lVar4 * 2;
        pvVar6 = (void *)(lVar4 * 2 + (long)pvVar6);
      }
      dst = (void *)((long)dst + (long)(iVar5 / -2 + dstride));
      lVar3 = lVar3 + sstride;
    }
    break;
  case dt_uint16:
    pvVar2 = (void *)((long)(vw * (sstride / 2)) * 2 + (long)src);
    lVar4 = (long)nchan;
    pvVar6 = (void *)(lVar4 * 2 + (long)src);
    lVar3 = (long)(sstride / 2) * 2;
    for (; src != pvVar2; src = (void *)((long)src + lVar3)) {
      pvVar9 = pvVar6;
      for (pvVar7 = src; pvVar7 != (void *)((long)(uw * nchan) * 2 + (long)src);
          pvVar7 = (void *)((long)pvVar7 + lVar4 * 4)) {
        for (lVar10 = 0; lVar4 * 2 != lVar10; lVar10 = lVar10 + 2) {
          *(short *)((long)dst + lVar10) =
               (short)((uint)*(ushort *)((long)pvVar9 + lVar10) +
                       (uint)*(ushort *)((long)pvVar7 + lVar10) >> 1);
        }
        dst = (void *)((long)dst + lVar10);
        pvVar9 = (void *)((long)pvVar9 + lVar4 * 4);
      }
      dst = (void *)((long)dst + (long)((uw * nchan) / -2 + dstride / 2) * 2);
      pvVar6 = (void *)((long)pvVar6 + lVar3);
    }
    break;
  case dt_half:
    pvVar2 = (void *)((long)(vw * (sstride / 2)) * 2 + (long)src);
    lVar4 = (long)nchan;
    local_68 = (void *)(lVar4 * 2 + (long)src);
    lVar3 = (long)(sstride / 2) * 2;
    for (; src != pvVar2; src = (void *)((long)src + lVar3)) {
      pvVar6 = local_68;
      for (pvVar7 = src; pvVar7 != (void *)((long)(uw * nchan) * 2 + (long)src);
          pvVar7 = (void *)((long)pvVar7 + lVar4 * 4)) {
        for (lVar10 = 0; lVar4 * 2 != lVar10; lVar10 = lVar10 + 2) {
          uVar1 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                 (ulong)*(ushort *)((long)pvVar7 + lVar10) * 4) +
                                      *(float *)(PtexHalf::h2fTable +
                                                (ulong)*(ushort *)((long)pvVar6 + lVar10) * 4)) *
                                      0.5);
          *(uint16_t *)((long)dst + lVar10) = uVar1;
        }
        dst = (void *)((long)dst + lVar10);
        pvVar6 = (void *)((long)pvVar6 + lVar4 * 4);
      }
      dst = (void *)((long)dst + (long)((uw * nchan) / -2 + dstride / 2) * 2);
      local_68 = (void *)((long)local_68 + lVar3);
    }
    break;
  case dt_float:
    pvVar2 = (void *)((long)(vw * (sstride / 4)) * 4 + (long)src);
    lVar4 = (long)nchan;
    pvVar6 = (void *)(lVar4 * 4 + (long)src);
    lVar3 = (long)(sstride / 4) * 4;
    for (; src != pvVar2; src = (void *)((long)src + lVar3)) {
      pvVar9 = pvVar6;
      for (pvVar7 = src; pvVar7 != (void *)((long)(uw * nchan) * 4 + (long)src);
          pvVar7 = (void *)((long)pvVar7 + lVar4 * 8)) {
        for (lVar10 = 0; lVar4 * 4 - lVar10 != 0; lVar10 = lVar10 + 4) {
          *(float *)((long)dst + lVar10) =
               (*(float *)((long)pvVar7 + lVar10) + *(float *)((long)pvVar9 + lVar10)) * 0.5;
        }
        dst = (void *)((long)dst + lVar10);
        pvVar9 = (void *)((long)pvVar9 + lVar4 * 8);
      }
      dst = (void *)((long)dst + (long)((uw * nchan) / -2 + dstride / 4) * 4);
      pvVar6 = (void *)((long)pvVar6 + lVar3);
    }
  }
  return;
}

Assistant:

void reduceu(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceu(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceu(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceu(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceu(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}